

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vox2obj.cpp
# Opt level: O0

void print_help(void)

{
  printf(
        "vox2animobj v2.0 by Justin Paver - source code available here: http://github.com/jpaver/opengametools \n\nThis tool can extract frames out of a given MagicaVoxel.vox and save them either as separate .obj files,\n or as a single .obj file with separate internal objects for each frame.\n\n usage: vox2animobj [optional args] <input_file.vox>\n\n [optional args] can be one or multiple of:\n --mesh_algorithm <algo> : (default: polygon) sets the meshing mode where <algo> is one of: simple, greedy or polygon\n --all_frames_in_one     : (default: disabled) specifies that all frames should be written into a single output file\n --output_name <name>    : (default: disabled): name of output files\n --scale <value>         : (default: 1.0): scaling factor to apply to output voxels\n --frames <first> <last> : which frame range to extract. If not specified, will extract all keyframes within the .vox file.\n --output_vox            : (default: disabled): if specified will output .vox files for each frame instead of .obj\nexample:\n  vox2animobj --mesh_algorithm polygon --output_name test --frames 0 119 --scale scene.vox\n\nThe above example uses polygon tessellation. will generate test.mtl/test.tga and the test.obj will contain 120 objects,\nwith each object representing a mesh of the entire frame within scene.vox\n"
        );
  return;
}

Assistant:

void print_help()
{
    printf(
        "vox2animobj v2.0 by Justin Paver - source code available here: http://github.com/jpaver/opengametools \n"
        "\n"
        "This tool can extract frames out of a given MagicaVoxel.vox and save them either as separate .obj files,\n"
        " or as a single .obj file with separate internal objects for each frame.\n"
        "\n"
        " usage: vox2animobj [optional args] <input_file.vox>\n"
        "\n"
        " [optional args] can be one or multiple of:\n"
        " --mesh_algorithm <algo> : (default: polygon) sets the meshing mode where <algo> is one of: simple, greedy or polygon\n"
        " --all_frames_in_one     : (default: disabled) specifies that all frames should be written into a single output file\n"
        " --output_name <name>    : (default: disabled): name of output files\n"
        " --scale <value>         : (default: 1.0): scaling factor to apply to output voxels\n"
        " --frames <first> <last> : which frame range to extract. If not specified, will extract all keyframes within the .vox file.\n"
        " --output_vox            : (default: disabled): if specified will output .vox files for each frame instead of .obj"
        "\n"
        "example:\n"
        "  vox2animobj --mesh_algorithm polygon --output_name test --frames 0 119 --scale scene.vox\n"
        "\n"
        "The above example uses polygon tessellation. will generate test.mtl/test.tga and the test.obj will contain 120 objects,\n"
        "with each object representing a mesh of the entire frame within scene.vox\n"
    );
}